

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opacity.c
# Opt level: O1

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  int iVar2;
  GLFWwindow *handle;
  float opacity;
  int height;
  int width;
  float local_54;
  int local_50;
  int local_4c;
  ulong local_48;
  undefined8 uStack_40;
  
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 != 0) {
    glfwWindowHint(0x2200c,1);
    handle = glfwCreateWindow(400,400,"Opacity",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(handle);
      gladLoadGL(glfwGetProcAddress);
      glfwSwapInterval(1);
      nk_glfw3_init(handle,NK_GLFW3_INSTALL_CALLBACKS);
      memset(&glfw.atlas,0,400);
      glfw.atlas.temporary.alloc = nk_malloc;
      glfw.atlas.temporary.free = nk_mfree;
      glfw.atlas.permanent.userdata.ptr = (void *)0x0;
      glfw.atlas.permanent.alloc = nk_malloc;
      glfw.atlas.permanent.free = nk_mfree;
      nk_font_atlas_begin(&glfw.atlas);
      nk_glfw3_font_stash_end();
      iVar2 = glfwWindowShouldClose(handle);
      if (iVar2 == 0) {
        do {
          glfwGetWindowSize(handle,&local_4c,&local_50);
          local_48 = CONCAT44((float)local_50,(float)local_4c);
          uStack_40 = 0;
          (*glad_glClear)(0x4000);
          nk_glfw3_new_frame();
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_48;
          iVar2 = nk_begin_titled(&glfw.ctx,"","",(nk_rect)(auVar1 << 0x40),0);
          if (iVar2 != 0) {
            local_54 = glfwGetWindowOpacity(handle);
            nk_row_layout(&glfw.ctx,NK_DYNAMIC,30.0,2,0);
            iVar2 = nk_slider_float(&glfw.ctx,0.0,&local_54,1.0,0.001);
            if (iVar2 != 0) {
              glfwSetWindowOpacity(handle,local_54);
            }
            nk_labelf(&glfw.ctx,0x11,"%0.3f",(double)local_54);
          }
          nk_end(&glfw.ctx);
          nk_glfw3_render(NK_ANTI_ALIASING_ON);
          glfwSwapBuffers(handle);
          glfwWaitEventsTimeout(1.0);
          iVar2 = glfwWindowShouldClose(handle);
        } while (iVar2 == 0);
      }
      nk_glfw3_shutdown();
      glfwTerminate();
      exit(0);
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    GLFWwindow* window;
    struct nk_context* nk;
    struct nk_font_atlas* atlas;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_SCALE_TO_MONITOR, GLFW_TRUE);

    window = glfwCreateWindow(400, 400, "Opacity", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);
    glfwSwapInterval(1);

    nk = nk_glfw3_init(window, NK_GLFW3_INSTALL_CALLBACKS);
    nk_glfw3_font_stash_begin(&atlas);
    nk_glfw3_font_stash_end();

    while (!glfwWindowShouldClose(window))
    {
        int width, height;
        struct nk_rect area;

        glfwGetWindowSize(window, &width, &height);
        area = nk_rect(0.f, 0.f, (float) width, (float) height);

        glClear(GL_COLOR_BUFFER_BIT);
        nk_glfw3_new_frame();
        if (nk_begin(nk, "", area, 0))
        {
            float opacity = glfwGetWindowOpacity(window);
            nk_layout_row_dynamic(nk, 30, 2);
            if (nk_slider_float(nk, 0.f, &opacity, 1.f, 0.001f))
                glfwSetWindowOpacity(window, opacity);
            nk_labelf(nk, NK_TEXT_LEFT, "%0.3f", opacity);
        }

        nk_end(nk);
        nk_glfw3_render(NK_ANTI_ALIASING_ON);

        glfwSwapBuffers(window);
        glfwWaitEventsTimeout(1.0);
    }

    nk_glfw3_shutdown();
    glfwTerminate();
    exit(EXIT_SUCCESS);
}